

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# two-masters.cpp
# Opt level: O0

void TestSerializationImpl<std::vector<float,std::allocator<float>>>
               (vector<float,_std::allocator<float>_> *obj)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Link *this;
  reference pvVar4;
  void *pvVar5;
  BlockID neighbor;
  Link *link;
  value_type gid;
  vector<int,_std::allocator<int>_> gids;
  RoundRobinAssigner assigner;
  int nblocks;
  Master master;
  Block<std::vector<float,_std::allocator<float>_>_> block;
  communicator comm;
  nullptr_t in_stack_ffffffffffffe748;
  BlockID *block_00;
  Block<std::vector<float,_std::allocator<float>_>_> *in_stack_ffffffffffffe750;
  Master *this_00;
  NeverSkip *__f;
  undefined4 in_stack_ffffffffffffe768;
  int in_stack_ffffffffffffe76c;
  RoundRobinAssigner *in_stack_ffffffffffffe770;
  vector<float,_std::allocator<float>_> *v1;
  Skip *s;
  int iVar6;
  Link *l;
  communicator *other;
  int in_stack_ffffffffffffe7cc;
  Master *in_stack_ffffffffffffe7d0;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffe7e8;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffe7f0;
  MemoryManagement *mem;
  bool remote;
  Master *this_01;
  Skip local_1798;
  int local_1770;
  int local_176c;
  void *local_1768;
  value_type local_175c;
  vector<int,_std::allocator<int>_> local_1758;
  int local_172c;
  NeverSkip local_1728 [32];
  Master local_1708;
  communicator local_20;
  
  other = &local_20;
  diy::mpi::communicator::communicator((communicator *)in_stack_ffffffffffffe750);
  Block<std::vector<float,_std::allocator<float>_>_>::Block(in_stack_ffffffffffffe750);
  diy::mpi::communicator::communicator
            ((communicator *)&local_1708.blocks_.save_.super__Function_base._M_manager,other);
  std::function<void_*()>::function
            ((function<void_*()> *)in_stack_ffffffffffffe750,in_stack_ffffffffffffe748);
  std::function<void_(void_*)>::function
            ((function<void_(void_*)> *)in_stack_ffffffffffffe750,in_stack_ffffffffffffe748);
  std::function<void_(const_void_*,_diy::BinaryBuffer_&)>::function
            ((function<void_(const_void_*,_diy::BinaryBuffer_&)> *)in_stack_ffffffffffffe750,
             in_stack_ffffffffffffe748);
  std::function<void_(void_*,_diy::BinaryBuffer_&)>::function
            ((function<void_(void_*,_diy::BinaryBuffer_&)> *)in_stack_ffffffffffffe750,
             in_stack_ffffffffffffe748);
  this = (Link *)operator_new(0x10);
  diy::Master::QueueSizePolicy::QueueSizePolicy
            ((QueueSizePolicy *)in_stack_ffffffffffffe750,(size_t)in_stack_ffffffffffffe748);
  __f = local_1728;
  this_00 = &local_1708;
  block_00 = (BlockID *)0x0;
  l = this;
  diy::Master::Master((Master *)master.mt_gen._M_x[0x162],(communicator *)master.mt_gen._M_x[0x161],
                      master.mt_gen._M_x[0x160]._4_4_,(int)master.mt_gen._M_x[0x160],
                      (CreateBlock *)master.mt_gen._M_x[0x15f],
                      (DestroyBlock *)master.mt_gen._M_x[0x15e],
                      (ExternalStorage *)master.mt_gen._M_x[0x164],
                      (SaveBlock *)master.mt_gen._M_x[0x165],(LoadBlock *)master.mt_gen._M_x[0x166],
                      (QueuePolicy *)master.mt_gen._M_x[0x167]);
  std::function<void_(void_*,_diy::BinaryBuffer_&)>::~function
            ((function<void_(void_*,_diy::BinaryBuffer_&)> *)0x10f759);
  std::function<void_(const_void_*,_diy::BinaryBuffer_&)>::~function
            ((function<void_(const_void_*,_diy::BinaryBuffer_&)> *)0x10f766);
  std::function<void_(void_*)>::~function((function<void_(void_*)> *)0x10f773);
  std::function<void_*()>::~function((function<void_*()> *)0x10f780);
  diy::mpi::communicator::~communicator((communicator *)0x10f78d);
  local_172c = diy::mpi::communicator::size(&local_20);
  diy::mpi::communicator::size(&local_20);
  diy::RoundRobinAssigner::Assigner
            ((RoundRobinAssigner *)this_00,(int)((ulong)block_00 >> 0x20),(int)block_00);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x10f7e5);
  diy::mpi::communicator::rank(&local_20);
  diy::RoundRobinAssigner::local_gids
            (in_stack_ffffffffffffe770,in_stack_ffffffffffffe76c,
             (vector<int,_std::allocator<int>_> *)this);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_1758,0);
  local_175c = *pvVar4;
  pvVar5 = operator_new(0x20);
  diy::Link::Link((Link *)this_00);
  if (local_175c < local_172c + -1) {
    iVar1 = local_175c + 1;
  }
  else {
    iVar1 = 0;
  }
  local_1770 = iVar1;
  local_1768 = pvVar5;
  iVar2 = diy::RoundRobinAssigner::rank
                    ((RoundRobinAssigner *)this_00,(int)((ulong)block_00 >> 0x20));
  local_176c = iVar2;
  diy::Link::add_neighbor((Link *)this_00,block_00);
  iVar6 = local_172c;
  if (0 < local_175c) {
    iVar6 = local_175c;
  }
  iVar6 = iVar6 + -1;
  local_1770 = iVar6;
  iVar3 = diy::RoundRobinAssigner::rank
                    ((RoundRobinAssigner *)this_00,(int)((ulong)block_00 >> 0x20));
  local_176c = iVar3;
  diy::Link::add_neighbor((Link *)this_00,block_00);
  std::vector<float,_std::allocator<float>_>::operator=
            (in_stack_ffffffffffffe7f0,in_stack_ffffffffffffe7e8);
  diy::Master::add(in_stack_ffffffffffffe7d0,in_stack_ffffffffffffe7cc,other,l);
  s = &local_1798;
  std::function<bool(int,diy::Master_const&)>::function<diy::Master::NeverSkip,void>
            ((function<bool_(int,_const_diy::Master_&)> *)this,__f);
  diy::Master::
  foreach<TestSerializationImpl<std::vector<float,std::allocator<float>>>(std::vector<float,std::allocator<float>>const&)::_lambda(Block<std::vector<float,std::allocator<float>>>*,diy::Master::ProxyWithLink_const&)_1_>
            ((Master *)CONCAT44(iVar1,iVar2),(anon_class_1_0_00000001 *)CONCAT44(iVar6,iVar3),s);
  std::function<bool_(int,_const_diy::Master_&)>::~function
            ((function<bool_(int,_const_diy::Master_&)> *)0x10f9b8);
  remote = false;
  this_01 = (Master *)0x0;
  mem = (MemoryManagement *)0x0;
  diy::MemoryManagement::MemoryManagement((MemoryManagement *)this_00);
  diy::Master::exchange(this_01,remote,mem);
  diy::MemoryManagement::~MemoryManagement((MemoryManagement *)this_00);
  v1 = (vector<float,_std::allocator<float>_> *)&stack0xffffffffffffe7d0;
  std::function<bool(int,diy::Master_const&)>::function<diy::Master::NeverSkip,void>
            ((function<bool_(int,_const_diy::Master_&)> *)this,__f);
  diy::Master::
  foreach<TestSerializationImpl<std::vector<float,std::allocator<float>>>(std::vector<float,std::allocator<float>>const&)::_lambda(Block<std::vector<float,std::allocator<float>>>*,diy::Master::ProxyWithLink_const&)_2_>
            ((Master *)CONCAT44(iVar1,iVar2),(anon_class_1_0_00000001 *)CONCAT44(iVar6,iVar3),s);
  std::function<bool_(int,_const_diy::Master_&)>::~function
            ((function<bool_(int,_const_diy::Master_&)> *)0x10fa63);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this);
  diy::RoundRobinAssigner::~RoundRobinAssigner((RoundRobinAssigner *)0x10fa7d);
  diy::Master::~Master(this_00);
  TestEqual<float>(v1,(vector<float,_std::allocator<float>_> *)
                      CONCAT44(in_stack_ffffffffffffe76c,in_stack_ffffffffffffe768));
  Block<std::vector<float,_std::allocator<float>_>_>::~Block
            ((Block<std::vector<float,_std::allocator<float>_>_> *)this_00);
  diy::mpi::communicator::~communicator((communicator *)0x10fabb);
  return;
}

Assistant:

void TestSerializationImpl(const T& obj)
{
  diy::mpi::communicator comm;
  Block<T> block;

  {
  diy::Master master(comm);

  auto nblocks = comm.size();
  diy::RoundRobinAssigner assigner(comm.size(), nblocks);

  std::vector<int> gids;
  assigner.local_gids(comm.rank(), gids);
  assert(gids.size() == 1);
  auto gid = gids[0];

  diy::Link* link = new diy::Link;
  diy::BlockID neighbor;

  // send neighbor
  neighbor.gid = (gid < (nblocks - 1)) ? (gid + 1) : 0;
  neighbor.proc = assigner.rank(neighbor.gid);
  link->add_neighbor(neighbor);

  // recv neighbor
  neighbor.gid = (gid > 0) ? (gid - 1) : (nblocks - 1);
  neighbor.proc = assigner.rank(neighbor.gid);
  link->add_neighbor(neighbor);

  block.send = obj;
  master.add(gid, &block, link);

  // compute, exchange, compute
  master.foreach([](Block<T> *b, const diy::Master::ProxyWithLink& cp) {
    cp.enqueue(cp.link()->target(0), b->send);
  });
  master.exchange();
  master.foreach([](Block<T> *b, const diy::Master::ProxyWithLink& cp) {
    cp.dequeue(cp.link()->target(1).gid, b->received);
  });

  //comm.barrier();
  }

  TestEqual(block.send, block.received);
}